

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

void mtbdd_sha2_rec(MTBDD dd,SHA256_CTX *ctx)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  MTBDD *data;
  long lVar5;
  uint64_t value;
  uint32_t type;
  uint64_t local_38;
  MTBDD local_30;
  uint32_t local_24;
  
  data = &local_38;
  local_30 = dd;
  if ((dd & 0x7fffffffffffffff) == 0) {
    data = &local_30;
  }
  else {
    puVar1 = nodes->data;
    lVar5 = (dd & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar5);
    if ((uVar2 >> 0x3d & 1) != 0) {
      return;
    }
    *(ulong *)(puVar1 + lVar5) = uVar2 | 0x2000000000000000;
    if ((uVar2 >> 0x3e & 1) == 0) {
      uVar3 = (uint)((ulong)*(undefined8 *)(puVar1 + lVar5 + 8) >> 0x20);
      uVar4 = (uVar3 >> 8) + 0x80000000;
      if ((uVar2 & 0xffffffffff) == 0) {
        uVar4 = uVar3 >> 8;
      }
      local_38 = CONCAT44(local_38._4_4_,uVar4);
      SHA256_Update((SHA256_CTX *)ctx,&local_38,4);
      mtbdd_sha2_rec(*(ulong *)(puVar1 + lVar5) & 0x800000ffffffffff,ctx);
      mtbdd_sha2_rec(*(ulong *)(puVar1 + lVar5 + 8) & 0xffffffffff,ctx);
      return;
    }
    local_24 = (uint32_t)uVar2;
    SHA256_Update((SHA256_CTX *)ctx,&local_24,4);
    local_38 = *(uint64_t *)(puVar1 + lVar5 + 8);
    local_38 = sylvan_mt_hash(local_24,local_38,local_38);
  }
  SHA256_Update((SHA256_CTX *)ctx,data,8);
  return;
}

Assistant:

static void
mtbdd_sha2_rec(MTBDD dd, SHA256_CTX *ctx)
{
    if (dd == mtbdd_true || dd == mtbdd_false) {
        SHA256_Update(ctx, (void*)&dd, sizeof(MTBDD));
        return;
    }

    mtbddnode_t node = MTBDD_GETNODE(dd);
    if (mtbddnode_getmark(node) == 0) {
        mtbddnode_setmark(node, 1);
        if (mtbddnode_isleaf(node)) {
            uint32_t type = mtbddnode_gettype(node);
            SHA256_Update(ctx, (void*)&type, sizeof(uint32_t));
            uint64_t value = mtbddnode_getvalue(node);
            value = sylvan_mt_hash(type, value, value);
            SHA256_Update(ctx, (void*)&value, sizeof(uint64_t));
        } else {
            uint32_t level = mtbddnode_getvariable(node);
            if (MTBDD_STRIPMARK(mtbddnode_gethigh(node))) level |= 0x80000000;
            SHA256_Update(ctx, (void*)&level, sizeof(uint32_t));
            mtbdd_sha2_rec(mtbddnode_gethigh(node), ctx);
            mtbdd_sha2_rec(mtbddnode_getlow(node), ctx);
        }
    }
}